

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__filename;
  long lVar1;
  bool bVar2;
  size_t sVar3;
  int *piVar4;
  unique_ptr<testbench::machine,_std::default_delete<testbench::machine>_> uVar5;
  undefined8 uVar6;
  undefined8 extraout_RAX;
  int iVar7;
  char **ppcVar8;
  allocator local_71;
  char *local_70 [4];
  string argument;
  
  sVar3 = testbench::machine::availability::count();
  if (sVar3 == 0) {
    fputs("Fatal error no machines implemented\n",_stderr);
    iVar7 = 1;
  }
  else {
    if (*argv != (char *)0x0) {
      ppcVar8 = argv + 1;
      program_name = *argv;
      while (*ppcVar8 != (char *)0x0) {
        std::__cxx11::string::string((string *)&argument,*ppcVar8,&local_71);
        bVar2 = std::operator==(&argument,"-h");
        iVar7 = 0;
        if (bVar2) {
LAB_0010562d:
          usage_exit(iVar7);
LAB_00105635:
          perror("Unable to write trace");
LAB_00105641:
          exit(1);
        }
        bVar2 = std::operator==(&argument,"--help");
        if (bVar2) goto LAB_0010562d;
        bVar2 = std::operator==(&argument,"-t");
        if (bVar2) {
LAB_00105470:
          __filename = ppcVar8[1];
          if ((__filename == (char *)0x0) || (*__filename == '\0')) {
            iVar7 = 2;
            goto LAB_0010562d;
          }
          piVar4 = __errno_location();
          *piVar4 = 0;
          trace_file = (FILE *)fopen(__filename,"w");
          if ((FILE *)trace_file != (FILE *)0x0) {
            ppcVar8 = ppcVar8 + 2;
            goto LAB_001054b2;
          }
          goto LAB_00105635;
        }
        bVar2 = std::operator==(&argument,"--trace");
        if (bVar2) goto LAB_00105470;
        ppcVar8 = ppcVar8 + 1;
        bVar2 = std::operator==(&argument,"-s");
        if (bVar2) {
          print_stats_on_exit = true;
        }
        else {
          std::__cxx11::string::string((string *)local_70,(string *)&argument);
          bVar2 = testbench::machine::availability::is(local_70[0]);
          if (bVar2) {
            uVar5._M_t.
            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t
            .super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
            super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                 (__uniq_ptr_data<testbench::machine,_std::default_delete<testbench::machine>,_true,_true>
                  )testbench::machine::create(local_70[0]);
            if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
                machine._M_t.
                super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
                _M_t.
                super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0)
            {
              lVar1 = *(long *)machine._M_t.
                               super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                               .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
              machine._M_t.
              super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
              _M_t.
              super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
              .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                   uVar5._M_t.
                   super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                   .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
              (**(code **)(lVar1 + 0x28))();
              uVar5._M_t.
              super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
              _M_t.
              super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
              .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                   machine._M_t.
                   super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                   .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
            }
            machine._M_t.
            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t
            .super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
            super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                 uVar5._M_t.
                 super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                 .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
            if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
                machine._M_t.
                super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
                _M_t.
                super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0)
            {
              fputs("Error initializing machine\n",_stderr);
              goto LAB_00105641;
            }
          }
          else {
            fprintf(_stderr,"Unkown machine: %s\n",local_70[0]);
          }
          std::__cxx11::string::~string((string *)local_70);
        }
LAB_001054b2:
        std::__cxx11::string::~string((string *)&argument);
      }
    }
    if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
        machine._M_t.
        super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t.
        super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
        super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0) {
      usage_exit(2);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&argument);
      _Unwind_Resume(extraout_RAX);
    }
    if (trace_file != (FILE *)0x0) {
      (**(code **)(*(long *)machine._M_t.
                            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                            .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl + 8))()
      ;
    }
    uVar6 = (*(code *)**(undefined8 **)
                        machine._M_t.
                        super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                        .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl)
                      (machine._M_t.
                       super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                       .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl,_stdin,
                       _stdout);
    iVar7 = 0;
    if (print_stats_on_exit == true) {
      iVar7 = 0;
      printf("\nCycles: %llu\n",uVar6);
    }
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
    testbench::run_result result;

    if (testbench::machine::available.count() == 0) {   // forgot to link implementations?
        fputs("Fatal error no machines implemented\n", stderr);
        return 1;
    }
    process_arguments(argv);
    if (not machine) usage_exit(2);
    if (trace_file != nullptr) {
        machine->enable_trace(trace_file);
    }
    result = machine->run(stdin, stdout);
    if (print_stats_on_exit) {
        print_run_result(result);
    }
}